

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O0

uint readuint(FILE *f,int bigendian)

{
  size_t sVar1;
  byte local_20;
  byte local_1f;
  byte local_1e;
  byte local_1d;
  int local_1c;
  uchar c4;
  uchar c3;
  uchar c2;
  uchar c1;
  int bigendian_local;
  FILE *f_local;
  
  local_1c = bigendian;
  _c4 = (FILE *)f;
  sVar1 = fread(&local_1d,1,1,(FILE *)f);
  if (sVar1 == 0) {
    fprintf(_stderr,"\nError: fread return a number of element different from the expected.\n");
    f_local._4_4_ = 0;
  }
  else {
    sVar1 = fread(&local_1e,1,1,_c4);
    if (sVar1 == 0) {
      fprintf(_stderr,"\nError: fread return a number of element different from the expected.\n");
      f_local._4_4_ = 0;
    }
    else {
      sVar1 = fread(&local_1f,1,1,_c4);
      if (sVar1 == 0) {
        fprintf(_stderr,"\nError: fread return a number of element different from the expected.\n");
        f_local._4_4_ = 0;
      }
      else {
        sVar1 = fread(&local_20,1,1,_c4);
        if (sVar1 == 0) {
          fprintf(_stderr,"\nError: fread return a number of element different from the expected.\n"
                 );
          f_local._4_4_ = 0;
        }
        else if (local_1c == 0) {
          f_local._4_4_ =
               (uint)local_20 * 0x1000000 + (uint)local_1f * 0x10000 + (uint)local_1e * 0x100 +
               (uint)local_1d;
        }
        else {
          f_local._4_4_ =
               (uint)local_1d * 0x1000000 + (uint)local_1e * 0x10000 + (uint)local_1f * 0x100 +
               (uint)local_20;
        }
      }
    }
  }
  return f_local._4_4_;
}

Assistant:

static unsigned int readuint(FILE * f, int bigendian)
{
    unsigned char c1, c2, c3, c4;
    if ( !fread(&c1, 1, 1, f) )
    {
        fprintf(stderr, "\nError: fread return a number of element different from the expected.\n");
        return 0;
    }
    if ( !fread(&c2, 1, 1, f) )
    {
        fprintf(stderr, "\nError: fread return a number of element different from the expected.\n");
        return 0;
    }
    if ( !fread(&c3, 1, 1, f) )
    {
        fprintf(stderr, "\nError: fread return a number of element different from the expected.\n");
        return 0;
    }
    if ( !fread(&c4, 1, 1, f) )
    {
        fprintf(stderr, "\nError: fread return a number of element different from the expected.\n");
        return 0;
    }
    if (bigendian)
        return (unsigned int)(c1 << 24) + (unsigned int)(c2 << 16) + (unsigned int)(c3 << 8) + c4;
    else
        return (unsigned int)(c4 << 24) + (unsigned int)(c3 << 16) + (unsigned int)(c2 << 8) + c1;
}